

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O3

void secp256k1_scalar_negate(secp256k1_scalar *r,secp256k1_scalar *a)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint64_t uVar7;
  ulong uVar8;
  ulong uVar9;
  uint64_t uVar10;
  ulong uVar11;
  
  uVar1 = a->d[1];
  uVar2 = a->d[2];
  uVar3 = a->d[3];
  uVar4 = a->d[0];
  uVar7 = 0;
  uVar10 = ~uVar4 + 0xbfd25e8cd0364142;
  if (((uVar1 == 0 && uVar2 == 0) && uVar3 == 0) && uVar4 == 0) {
    uVar10 = uVar7;
  }
  r->d[0] = uVar10;
  uVar5 = (ulong)(0x402da1732fc9bebd < ~uVar4);
  uVar8 = ~a->d[1] + uVar5;
  uVar10 = uVar8 + 0xbaaedce6af48a03b;
  if (((uVar1 == 0 && uVar2 == 0) && uVar3 == 0) && uVar4 == 0) {
    uVar10 = uVar7;
  }
  uVar9 = (ulong)CARRY8(~a->d[1],uVar5);
  r->d[1] = uVar10;
  uVar5 = a->d[2];
  uVar8 = (ulong)(0x4551231950b75fc4 < uVar8);
  uVar6 = ~uVar5 + uVar9;
  uVar11 = uVar6 + uVar8;
  uVar10 = uVar11 - 2;
  if (((uVar1 == 0 && uVar2 == 0) && uVar3 == 0) && uVar4 == 0) {
    uVar10 = uVar7;
  }
  r->d[2] = uVar10;
  uVar10 = (((ulong)(CARRY8(~uVar5,uVar9) || CARRY8(uVar6,uVar8)) + (ulong)(1 < uVar11)) - a->d[3])
           - 2;
  if (((uVar1 == 0 && uVar2 == 0) && uVar3 == 0) && uVar4 == 0) {
    uVar10 = uVar7;
  }
  r->d[3] = uVar10;
  return;
}

Assistant:

static void secp256k1_scalar_negate(secp256k1_scalar *r, const secp256k1_scalar *a) {
    uint64_t nonzero = 0xFFFFFFFFFFFFFFFFULL * (secp256k1_scalar_is_zero(a) == 0);
    secp256k1_uint128 t;
    secp256k1_u128_from_u64(&t, ~a->d[0]);
    secp256k1_u128_accum_u64(&t, SECP256K1_N_0 + 1);
    r->d[0] = secp256k1_u128_to_u64(&t) & nonzero; secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, ~a->d[1]);
    secp256k1_u128_accum_u64(&t, SECP256K1_N_1);
    r->d[1] = secp256k1_u128_to_u64(&t) & nonzero; secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, ~a->d[2]);
    secp256k1_u128_accum_u64(&t, SECP256K1_N_2);
    r->d[2] = secp256k1_u128_to_u64(&t) & nonzero; secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, ~a->d[3]);
    secp256k1_u128_accum_u64(&t, SECP256K1_N_3);
    r->d[3] = secp256k1_u128_to_u64(&t) & nonzero;
}